

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void obj_ReadFile(char *fileName,uint fileID)

{
  FileStackNode *pFVar1;
  bool bVar2;
  FileStackNodes *pFVar3;
  uint uVar4;
  int iVar5;
  FileStackNodeType FVar6;
  ExportLevel EVar7;
  SectionType SVar8;
  FILE *__stream;
  FileStackNode *pFVar9;
  char *pcVar10;
  ulong uVar11;
  uint32_t *puVar12;
  Symbol **ppSVar13;
  SymbolList *pSVar14;
  void *__ptr;
  Symbol *pSVar15;
  void *__ptr_00;
  Section *pSVar16;
  uint8_t *__ptr_01;
  size_t sVar17;
  Patch *patch;
  Symbol **ppSVar18;
  Assertion *patch_00;
  int *piVar19;
  byte bVar20;
  SectionModifier SVar21;
  FileStackNode *pFVar22;
  long lVar23;
  Symbol *pSVar24;
  FileStackNodeType FVar25;
  uint uVar26;
  long lVar27;
  char *fmt;
  char *pcVar28;
  undefined8 uVar29;
  uint32_t uVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  int matchedElems;
  int local_64;
  Patch *local_60;
  ulong local_58;
  FileStackNode *local_50;
  char local_48 [24];
  
  uVar4 = (byte)*fileName - 0x2d;
  if (uVar4 == 0) {
    uVar4 = (uint)(byte)fileName[1];
  }
  if (uVar4 == 0) {
    __stream = fdopen(0,"rb");
  }
  else {
    __stream = fopen(fileName,"rb");
  }
  if (__stream == (FILE *)0x0) {
    pcVar10 = "Could not open file %s";
  }
  else {
    iVar5 = getc(__stream);
    ungetc(iVar5,__stream);
    pFVar3 = nodes;
    if (iVar5 == 0x52) {
      iVar5 = __isoc99_fscanf(__stream,"RGB9%n",&local_64);
      if ((iVar5 == 1) && (local_64 != 4)) {
        errx("%s: Not a RGBDS object file",fileName);
      }
      if (beVerbose == true) {
        fprintf(_stderr,"Reading object file %s\n",fileName);
      }
      uVar32 = 0;
      uVar4 = 0xfffffff8;
      do {
        iVar5 = getc(__stream);
        if (iVar5 == -1) {
          iVar5 = feof(__stream);
          if (iVar5 == 0) {
            piVar19 = __errno_location();
            pcVar10 = strerror(*piVar19);
          }
          else {
            pcVar10 = "Unexpected end of file";
          }
          pcVar28 = "%s: Cannot read revision number: %s";
          goto LAB_0010509d;
        }
        uVar4 = uVar4 + 8;
        uVar32 = uVar32 | iVar5 << ((byte)uVar4 & 0x1f);
      } while (uVar4 < 0x18);
      if (uVar32 != 9) {
        pcVar10 = get_package_version_string();
        pcVar28 = "";
        if (9 < uVar32) {
          pcVar28 = " or updating rgblink";
        }
        errx("%s: Unsupported object file for rgblink %s; try rebuilding \"%s\"%s (expected revision %d, got %d)"
             ,fileName,pcVar10,fileName,pcVar28,9,uVar32);
      }
      uVar4 = 0;
      uVar32 = 0xfffffff8;
      do {
        iVar5 = getc(__stream);
        if (iVar5 == -1) {
          iVar5 = feof(__stream);
          if (iVar5 == 0) {
            piVar19 = __errno_location();
            pcVar10 = strerror(*piVar19);
          }
          else {
            pcVar10 = "Unexpected end of file";
          }
          pcVar28 = "%s: Cannot read number of symbols: %s";
          goto LAB_0010509d;
        }
        uVar32 = uVar32 + 8;
        uVar4 = uVar4 | iVar5 << ((byte)uVar32 & 0x1f);
      } while (uVar32 < 0x18);
      uVar11 = (ulong)uVar4;
      uVar31 = 0;
      uVar32 = 0xfffffff8;
      do {
        iVar5 = getc(__stream);
        if (iVar5 == -1) {
          iVar5 = feof(__stream);
          if (iVar5 == 0) {
            piVar19 = __errno_location();
            pcVar10 = strerror(*piVar19);
          }
          else {
            pcVar10 = "Unexpected end of file";
          }
          pcVar28 = "%s: Cannot read number of sections: %s";
          goto LAB_0010509d;
        }
        uVar32 = uVar32 + 8;
        uVar26 = (uint)uVar31 | iVar5 << ((byte)uVar32 & 0x1f);
        uVar31 = (ulong)uVar26;
      } while (uVar32 < 0x18);
      nbSectionsToAssign = nbSectionsToAssign + uVar31;
      uVar30 = 0;
      uVar32 = 0xfffffff8;
      local_58 = uVar31;
      do {
        iVar5 = getc(__stream);
        pFVar3 = nodes;
        if (iVar5 == -1) {
          iVar5 = feof(__stream);
          if (iVar5 == 0) {
            piVar19 = __errno_location();
            pcVar10 = strerror(*piVar19);
          }
          else {
            pcVar10 = "Unexpected end of file";
          }
          pcVar28 = "%s: Cannot read number of nodes: %s";
          goto LAB_0010509d;
        }
        uVar32 = uVar32 + 8;
        uVar30 = uVar30 | iVar5 << ((byte)uVar32 & 0x1f);
      } while (uVar32 < 0x18);
      nodes[fileID].nbNodes = uVar30;
      pFVar9 = (FileStackNode *)calloc((ulong)uVar30,0x20);
      pFVar3[fileID].nodes = pFVar9;
      if (pFVar9 != (FileStackNode *)0x0) {
        if (beVerbose == true) {
          fprintf(_stderr,"Reading %u nodes...\n",(ulong)uVar30);
          uVar30 = nodes[fileID].nbNodes;
        }
        if (uVar30 != 0) {
          uVar31 = (ulong)uVar30;
          do {
            uVar31 = uVar31 - 1;
            pFVar9 = nodes[fileID].nodes;
            uVar32 = 0xfffffff8;
            uVar33 = 0;
            do {
              iVar5 = getc(__stream);
              if (iVar5 == -1) {
                iVar5 = feof(__stream);
                if (iVar5 == 0) {
                  piVar19 = __errno_location();
                  pcVar10 = strerror(*piVar19);
                }
                else {
                  pcVar10 = "Unexpected end of file";
                }
                pcVar28 = "%s: Cannot read node #%u\'s parent ID: %s";
                goto LAB_00104c97;
              }
              uVar32 = uVar32 + 8;
              uVar33 = uVar33 | iVar5 << ((byte)uVar32 & 0x1f);
            } while (uVar32 < 0x18);
            uVar32 = 0;
            pFVar22 = (FileStackNode *)0x0;
            if (uVar33 != 0xffffffff) {
              pFVar22 = pFVar9 + uVar33;
            }
            pFVar1 = pFVar9 + uVar31;
            pFVar9[uVar31].parent = pFVar22;
            uVar33 = 0xfffffff8;
            do {
              iVar5 = getc(__stream);
              if (iVar5 == -1) {
                iVar5 = feof(__stream);
                if (iVar5 == 0) {
                  piVar19 = __errno_location();
                  pcVar10 = strerror(*piVar19);
                }
                else {
                  pcVar10 = "Unexpected end of file";
                }
                pcVar28 = "%s: Cannot read node #%u\'s line number: %s";
                goto LAB_00104c97;
              }
              uVar33 = uVar33 + 8;
              uVar32 = uVar32 | iVar5 << ((byte)uVar33 & 0x1f);
            } while (uVar33 < 0x18);
            pFVar1->lineNo = uVar32;
            FVar6 = getc(__stream);
            if (FVar6 == ~NODE_REPT) {
              iVar5 = feof(__stream);
              if (iVar5 == 0) {
                piVar19 = __errno_location();
                pcVar10 = strerror(*piVar19);
              }
              else {
                pcVar10 = "Unexpected end of file";
              }
              pcVar28 = "%s: Cannot read node #%u\'s type: %s";
LAB_00104c97:
              errx(pcVar28,fileName,uVar31 & 0xffffffff,pcVar10);
            }
            pFVar1->type = FVar6;
            if (FVar6 - NODE_FILE < 2) {
              pcVar10 = readstr((FILE *)__stream);
              if (pcVar10 == (char *)0x0) {
                iVar5 = feof(__stream);
                if (iVar5 == 0) {
                  piVar19 = __errno_location();
                  pcVar10 = strerror(*piVar19);
                }
                else {
                  pcVar10 = "Unexpected end of file";
                }
                pcVar28 = "%s: Cannot read node #%u\'s file name: %s";
                goto LAB_00104c97;
              }
              (pFVar1->field_3).name = pcVar10;
            }
            else {
              FVar25 = FVar6;
              if (FVar6 == NODE_REPT) {
                do {
                  iVar5 = getc(__stream);
                  if (iVar5 == -1) {
                    iVar5 = feof(__stream);
                    if (iVar5 == 0) {
                      piVar19 = __errno_location();
                      pcVar10 = strerror(*piVar19);
                    }
                    else {
                      pcVar10 = "Unexpected end of file";
                    }
                    pcVar28 = "%s: Cannot read node #%u\'s rept depth: %s";
                    goto LAB_00104c97;
                  }
                  FVar6 = FVar6 | iVar5 << ((byte)FVar25 & 0x1f);
                  bVar2 = FVar25 < 0x18;
                  FVar25 = FVar25 + 8;
                } while (bVar2);
                (pFVar1->field_3).field_1.reptDepth = FVar6;
                puVar12 = (uint32_t *)malloc((ulong)FVar6 << 2);
                (pFVar1->field_3).field_1.iters = puVar12;
                if (puVar12 == (uint32_t *)0x0) {
                  piVar19 = __errno_location();
                  pcVar10 = strerror(*piVar19);
                  fatal((FileStackNode *)0x0,0,"%s: Failed to alloc node #%u\'s iters: %s",fileName,
                        uVar31 & 0xffffffff,pcVar10);
                }
                if (FVar6 != NODE_REPT) {
                  uVar34 = 0;
                  do {
                    uVar32 = 0;
                    uVar33 = 0xfffffff8;
                    do {
                      iVar5 = getc(__stream);
                      if (iVar5 == -1) {
                        iVar5 = feof(__stream);
                        if (iVar5 == 0) {
                          piVar19 = __errno_location();
                          pcVar10 = strerror(*piVar19);
                        }
                        else {
                          pcVar10 = "Unexpected end of file";
                        }
                        errx("%s: Cannot read node #%u\'s iter #%u: %s",fileName,uVar31 & 0xffffffff
                             ,uVar34 & 0xffffffff,pcVar10);
                      }
                      uVar33 = uVar33 + 8;
                      uVar32 = uVar32 | iVar5 << ((byte)uVar33 & 0x1f);
                    } while (uVar33 < 0x18);
                    (pFVar1->field_3).field_1.iters[uVar34] = uVar32;
                    uVar34 = uVar34 + 1;
                  } while (uVar34 < (pFVar1->field_3).field_1.reptDepth);
                }
                if (pFVar1->parent == (FileStackNode *)0x0) {
                  fatal((FileStackNode *)0x0,0,
                        "%s is not a valid object file: root node (#%u) may not be REPT",fileName,
                        uVar31 & 0xffffffff);
                }
              }
            }
          } while (uVar31 != 0);
        }
        ppSVar13 = (Symbol **)malloc(uVar11 * 8 + 1);
        if (ppSVar13 == (Symbol **)0x0) {
          pcVar10 = "Failed to get memory for %s\'s symbols";
        }
        else {
          pSVar14 = (SymbolList *)malloc(0x18);
          if (pSVar14 != (SymbolList *)0x0) {
            pSVar14->symbolList = ppSVar13;
            pSVar14->nbSymbols = uVar11;
            pSVar14->next = symbolLists;
            uVar31 = (ulong)(uVar26 + (uVar26 == 0));
            symbolLists = pSVar14;
            __ptr = calloc(uVar31,4);
            if (beVerbose == true) {
              fprintf(_stderr,"Reading %u symbols...\n",(ulong)uVar4);
            }
            if (uVar4 != 0) {
              uVar34 = 0;
              do {
                pSVar15 = (Symbol *)malloc(0x38);
                if (pSVar15 == (Symbol *)0x0) {
                  pcVar10 = "%s: Couldn\'t create new symbol";
                  goto LAB_00105031;
                }
                pFVar9 = nodes[fileID].nodes;
                pcVar10 = readstr((FILE *)__stream);
                if (pcVar10 == (char *)0x0) {
                  iVar5 = feof(__stream);
                  if (iVar5 == 0) {
                    piVar19 = __errno_location();
                    pcVar10 = strerror(*piVar19);
                  }
                  else {
                    pcVar10 = "Unexpected end of file";
                  }
                  pcVar28 = "%s: Cannot read symbol name: %s";
                  goto LAB_0010509d;
                }
                pSVar15->name = pcVar10;
                EVar7 = getc(__stream);
                if (EVar7 == ~SYMTYPE_LOCAL) {
                  pcVar10 = pSVar15->name;
                  goto LAB_00104f72;
                }
                pSVar15->type = EVar7;
                if (EVar7 == SYMTYPE_IMPORT) {
                  pSVar15->sectionID = -1;
                  ppSVar13[uVar34] = pSVar15;
                }
                else {
                  pSVar15->objFileName = fileName;
                  uVar32 = 0;
                  uVar33 = 0xfffffff8;
                  do {
                    iVar5 = getc(__stream);
                    if (iVar5 == -1) {
                      pcVar10 = pSVar15->name;
                      iVar5 = feof(__stream);
                      if (iVar5 == 0) {
                        piVar19 = __errno_location();
                        pcVar28 = strerror(*piVar19);
                      }
                      else {
                        pcVar28 = "Unexpected end of file";
                      }
                      fmt = "%s: Cannot read \"%s\"\'s node ID: %s";
                      goto LAB_00104dae;
                    }
                    uVar33 = uVar33 + 8;
                    uVar32 = uVar32 | iVar5 << ((byte)uVar33 & 0x1f);
                  } while (uVar33 < 0x18);
                  pSVar15->src = pFVar9 + uVar32;
                  uVar32 = 0;
                  uVar33 = 0xfffffff8;
                  do {
                    iVar5 = getc(__stream);
                    if (iVar5 == -1) {
                      pcVar10 = pSVar15->name;
                      iVar5 = feof(__stream);
                      if (iVar5 == 0) {
                        piVar19 = __errno_location();
                        pcVar28 = strerror(*piVar19);
                      }
                      else {
                        pcVar28 = "Unexpected end of file";
                      }
                      fmt = "%s: Cannot read \"%s\"\'s line number: %s";
                      goto LAB_00104dae;
                    }
                    uVar33 = uVar33 + 8;
                    uVar32 = uVar32 | iVar5 << ((byte)uVar33 & 0x1f);
                  } while (uVar33 < 0x18);
                  pSVar15->lineNo = uVar32;
                  uVar32 = 0;
                  uVar33 = 0xfffffff8;
                  do {
                    iVar5 = getc(__stream);
                    if (iVar5 == -1) {
                      pcVar10 = pSVar15->name;
                      iVar5 = feof(__stream);
                      if (iVar5 == 0) {
                        piVar19 = __errno_location();
                        pcVar28 = strerror(*piVar19);
                      }
                      else {
                        pcVar28 = "Unexpected end of file";
                      }
                      fmt = "%s: Cannot read \"%s\"\'s section ID: %s";
                      goto LAB_00104dae;
                    }
                    uVar33 = uVar33 + 8;
                    uVar32 = uVar32 | iVar5 << ((byte)uVar33 & 0x1f);
                  } while (uVar33 < 0x18);
                  pSVar15->sectionID = uVar32;
                  uVar32 = 0;
                  uVar33 = 0xfffffff8;
                  do {
                    iVar5 = getc(__stream);
                    if (iVar5 == -1) {
                      pcVar10 = pSVar15->name;
                      iVar5 = feof(__stream);
                      if (iVar5 == 0) {
                        piVar19 = __errno_location();
                        pcVar28 = strerror(*piVar19);
                      }
                      else {
                        pcVar28 = "Unexpected end of file";
                      }
                      fmt = "%s: Cannot read \"%s\"\'s value: %s";
                      goto LAB_00104dae;
                    }
                    uVar33 = uVar33 + 8;
                    uVar32 = uVar32 | iVar5 << ((byte)uVar33 & 0x1f);
                  } while (uVar33 < 0x18);
                  (pSVar15->field_6).offset = uVar32;
                  EVar7 = pSVar15->type;
                  ppSVar13[uVar34] = pSVar15;
                  if (EVar7 == SYMTYPE_EXPORT) {
                    sym_AddSymbol(pSVar15);
                  }
                }
                if ((long)pSVar15->sectionID != -1) {
                  piVar19 = (int *)((long)__ptr + (long)pSVar15->sectionID * 4);
                  *piVar19 = *piVar19 + 1;
                }
                uVar34 = uVar34 + 1;
              } while (uVar34 != uVar11);
            }
            __ptr_00 = malloc(uVar31 << 3);
            if (beVerbose != false) {
              fprintf(_stderr,"Reading %u sections...\n",(ulong)uVar26);
            }
            if (uVar26 == 0) {
              free(__ptr);
            }
            else {
              uVar31 = 0;
              do {
                pSVar16 = (Section *)malloc(0x60);
                *(Section **)((long)__ptr_00 + uVar31 * 8) = pSVar16;
                if (pSVar16 == (Section *)0x0) {
                  pcVar10 = "%s: Couldn\'t create new section";
                  goto LAB_00105031;
                }
                pSVar16->nextu = (Section *)0x0;
                pFVar9 = nodes[fileID].nodes;
                pcVar10 = readstr((FILE *)__stream);
                if (pcVar10 == (char *)0x0) {
                  iVar5 = feof(__stream);
                  if (iVar5 == 0) {
                    piVar19 = __errno_location();
                    pcVar10 = strerror(*piVar19);
                  }
                  else {
                    pcVar10 = "Unexpected end of file";
                  }
                  pcVar28 = "%s: Cannot read section name: %s";
                  goto LAB_0010509d;
                }
                pSVar16->name = pcVar10;
                uVar33 = 0;
                uVar32 = 0xfffffff8;
                do {
                  iVar5 = getc(__stream);
                  if (iVar5 == -1) {
                    pcVar10 = pSVar16->name;
                    iVar5 = feof(__stream);
                    if (iVar5 == 0) {
                      piVar19 = __errno_location();
                      pcVar28 = strerror(*piVar19);
                    }
                    else {
                      pcVar28 = "Unexpected end of file";
                    }
                    fmt = "%s: Cannot read \"%s\"\'s\' size: %s";
                    goto LAB_00104dae;
                  }
                  uVar32 = uVar32 + 8;
                  uVar33 = uVar33 | iVar5 << ((byte)uVar32 & 0x1f);
                } while (uVar32 < 0x18);
                if (0xffff < uVar33) {
                  errx("\"%s\"\'s section size (%d) is invalid",pSVar16->name,(ulong)uVar33);
                }
                pSVar16->size = (uint16_t)uVar33;
                pSVar16->offset = 0;
                SVar8 = getc(__stream);
                if (SVar8 == ~SECTTYPE_WRAM0) {
                  pcVar10 = pSVar16->name;
LAB_00104f72:
                  iVar5 = feof(__stream);
                  if (iVar5 == 0) {
                    piVar19 = __errno_location();
                    pcVar28 = strerror(*piVar19);
                  }
                  else {
                    pcVar28 = "Unexpected end of file";
                  }
                  fmt = "%s: Cannot read \"%s\"\'s type: %s";
LAB_00104dae:
                  errx(fmt,fileName,pcVar10,pcVar28);
                }
                pSVar16->type = SVar8 & 0x3f;
                if ((SVar8 & 0xff) < 0x80) {
                  if ((SVar8 & 0xff) < 0x40) {
                    pSVar16->modifier = SECTION_NORMAL;
                  }
                  else {
                    pSVar16->modifier = SECTION_FRAGMENT;
                  }
                }
                else {
                  pSVar16->modifier = SECTION_UNION;
                }
                uVar33 = 0;
                uVar32 = 0xfffffff8;
                do {
                  iVar5 = getc(__stream);
                  if (iVar5 == -1) {
                    pcVar10 = pSVar16->name;
                    iVar5 = feof(__stream);
                    if (iVar5 == 0) {
                      piVar19 = __errno_location();
                      pcVar28 = strerror(*piVar19);
                    }
                    else {
                      pcVar28 = "Unexpected end of file";
                    }
                    fmt = "%s: Cannot read \"%s\"\'s org: %s";
                    goto LAB_00104dae;
                  }
                  uVar32 = uVar32 + 8;
                  uVar33 = uVar33 | iVar5 << ((byte)uVar32 & 0x1f);
                } while (uVar32 < 0x18);
                pSVar16->isAddressFixed = -1 < (int)uVar33;
                local_50 = pFVar9;
                if (0xffff < (int)uVar33) {
                  error((FileStackNode *)0x0,0,"\"%s\"\'s org is too large (%d)",pSVar16->name);
                  uVar33 = 0xffff;
                }
                pSVar16->org = (uint16_t)uVar33;
                uVar33 = 0;
                uVar32 = 0xfffffff8;
                do {
                  iVar5 = getc(__stream);
                  if (iVar5 == -1) {
                    pcVar10 = pSVar16->name;
                    iVar5 = feof(__stream);
                    if (iVar5 == 0) {
                      piVar19 = __errno_location();
                      pcVar28 = strerror(*piVar19);
                    }
                    else {
                      pcVar28 = "Unexpected end of file";
                    }
                    fmt = "%s: Cannot read \"%s\"\'s bank: %s";
                    goto LAB_00104dae;
                  }
                  uVar32 = uVar32 + 8;
                  uVar33 = uVar33 | iVar5 << ((byte)uVar32 & 0x1f);
                } while (uVar32 < 0x18);
                pSVar16->isBankFixed = -1 < (int)uVar33;
                pSVar16->bank = uVar33;
                uVar32 = getc(__stream);
                if (uVar32 == 0xffffffff) {
                  pcVar10 = pSVar16->name;
                  iVar5 = feof(__stream);
                  if (iVar5 == 0) {
                    piVar19 = __errno_location();
                    pcVar28 = strerror(*piVar19);
                  }
                  else {
                    pcVar28 = "Unexpected end of file";
                  }
                  fmt = "%s: Cannot read \"%s\"\'s alignment: %s";
                  goto LAB_00104dae;
                }
                bVar20 = 0x10;
                if ((uVar32 & 0xff) < 0x10) {
                  bVar20 = (byte)uVar32;
                }
                pSVar16->isAlignFixed = (uVar32 & 0xff) != 0;
                pSVar16->alignMask = ~(ushort)(-1 << (bVar20 & 0x1f));
                uVar33 = 0;
                uVar32 = 0xfffffff8;
                do {
                  iVar5 = getc(__stream);
                  if (iVar5 == -1) {
                    pcVar10 = pSVar16->name;
                    iVar5 = feof(__stream);
                    if (iVar5 == 0) {
                      piVar19 = __errno_location();
                      pcVar28 = strerror(*piVar19);
                    }
                    else {
                      pcVar28 = "Unexpected end of file";
                    }
                    fmt = "%s: Cannot read \"%s\"\'s alignment offset: %s";
                    goto LAB_00104dae;
                  }
                  uVar32 = uVar32 + 8;
                  uVar33 = uVar33 | iVar5 << ((byte)uVar32 & 0x1f);
                } while (uVar32 < 0x18);
                if (0xffff < (int)uVar33) {
                  error((FileStackNode *)0x0,0,"\"%s\"\'s alignment offset is too large (%d)",
                        pSVar16->name);
                  uVar33 = 0xffff;
                }
                pSVar16->alignOfs = (uint16_t)uVar33;
                if (pSVar16->type == SECTTYPE_INVALID) goto LAB_00104dcb;
                if ((pSVar16->type & ~SECTTYPE_VRAM) == SECTTYPE_ROMX) {
                  uVar34 = (ulong)pSVar16->size;
                  __ptr_01 = (uint8_t *)malloc(uVar34 + 1);
                  if (__ptr_01 == (uint8_t *)0x0) {
                    pcVar10 = pSVar16->name;
                    pcVar28 = "%s: Unable to read \"%s\"\'s data";
LAB_001050d2:
                    err(pcVar28,fileName,pcVar10);
                  }
                  if ((uVar34 != 0) &&
                     (sVar17 = fread(__ptr_01,1,uVar34,__stream), sVar17 != pSVar16->size)) {
                    pcVar10 = pSVar16->name;
                    iVar5 = feof(__stream);
                    if (iVar5 == 0) {
                      piVar19 = __errno_location();
                      pcVar28 = strerror(*piVar19);
                    }
                    else {
                      pcVar28 = "Unexpected end of file";
                    }
                    fmt = "%s: Cannot read \"%s\"\'s data: %s";
                    goto LAB_00104dae;
                  }
                  pSVar16->data = __ptr_01;
                  uVar33 = 0;
                  uVar32 = 0xfffffff8;
                  do {
                    iVar5 = getc(__stream);
                    if (iVar5 == -1) {
                      pcVar10 = pSVar16->name;
                      iVar5 = feof(__stream);
                      if (iVar5 == 0) {
                        piVar19 = __errno_location();
                        pcVar28 = strerror(*piVar19);
                      }
                      else {
                        pcVar28 = "Unexpected end of file";
                      }
                      fmt = "%s: Cannot read \"%s\"\'s number of patches: %s";
                      goto LAB_00104dae;
                    }
                    uVar32 = uVar32 + 8;
                    uVar33 = uVar33 | iVar5 << ((byte)uVar32 & 0x1f);
                  } while (uVar32 < 0x18);
                  pSVar16->nbPatches = uVar33;
                  patch = (Patch *)malloc((ulong)uVar33 * 0x30 + 1);
                  pFVar9 = local_50;
                  if (patch == (Patch *)0x0) {
                    pcVar10 = pSVar16->name;
                    pcVar28 = "%s: Unable to read \"%s\"\'s patches";
                    goto LAB_001050d2;
                  }
                  lVar23 = 0x38;
                  if (uVar33 != 0) {
                    uVar34 = 0;
                    local_60 = patch;
                    do {
                      readPatch((FILE *)__stream,patch,fileName,pSVar16->name,(uint32_t)uVar34,
                                pFVar9);
                      uVar34 = uVar34 + 1;
                      patch = patch + 1;
                    } while (uVar34 < pSVar16->nbPatches);
                    lVar23 = 0x38;
                    patch = local_60;
                  }
                }
                else {
                  lVar23 = 0x28;
                  patch = (Patch *)0x0;
                }
                *(Patch **)((long)&pSVar16->name + lVar23) = patch;
                pSVar16->fileSymbols = ppSVar13;
                uVar34 = (ulong)*(uint *)((long)__ptr + uVar31 * 4);
                if (uVar34 == 0) {
                  pSVar16->symbols = (Symbol **)0x0;
                }
                else {
                  ppSVar18 = (Symbol **)malloc(uVar34 << 3);
                  pSVar16->symbols = ppSVar18;
                  if (ppSVar18 == (Symbol **)0x0) {
                    pcVar10 = "%s: Couldn\'t link to symbols";
                    goto LAB_00105031;
                  }
                }
                pSVar16->nbSymbols = 0;
                sect_AddSection(pSVar16);
                uVar31 = uVar31 + 1;
              } while (uVar31 != local_58);
              free(__ptr);
              if (uVar26 != 0) {
                uVar32 = 0;
                do {
                  lVar23 = *(long *)((long)__ptr_00 + (ulong)uVar32 * 8);
                  if (*(uint *)(lVar23 + 0xc) == 8) {
LAB_00104dcb:
                    __assert_fail("type != SECTTYPE_INVALID",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/include/linkdefs.hpp"
                                  ,0x65,"bool sect_HasData(enum SectionType)");
                  }
                  if (((*(uint *)(lVar23 + 0xc) & 0xfffffffe) == 2) &&
                     (uVar33 = *(uint *)(lVar23 + 0x30), (ulong)uVar33 != 0)) {
                    lVar23 = *(long *)(lVar23 + 0x38);
                    lVar27 = 0;
                    do {
                      uVar31 = (ulong)*(uint *)(lVar23 + 0x10 + lVar27);
                      if (uVar31 == 0xffffffff) {
                        uVar29 = 0;
                      }
                      else {
                        uVar29 = *(undefined8 *)((long)__ptr_00 + uVar31 * 8);
                      }
                      *(undefined8 *)(lVar23 + 0x28 + lVar27) = uVar29;
                      lVar27 = lVar27 + 0x30;
                    } while ((ulong)uVar33 * 0x30 != lVar27);
                  }
                  uVar32 = uVar32 + 1;
                } while (uVar32 != uVar26);
              }
            }
            if (uVar4 != 0) {
              uVar31 = 0;
              do {
                pSVar15 = ppSVar13[uVar31];
                if ((long)pSVar15->sectionID == -1) {
                  pSVar16 = (Section *)0x0;
                }
                else {
                  pSVar16 = *(Section **)((long)__ptr_00 + (long)pSVar15->sectionID * 8);
                  uVar4 = pSVar16->nbSymbols;
                  if (uVar4 == 0) {
                    uVar32 = 0;
                    pSVar24 = pSVar15;
                    goto LAB_00104890;
                  }
                  uVar32 = 0;
                  uVar26 = uVar4;
                  do {
                    uVar33 = uVar32 + uVar26 >> 1;
                    if ((pSVar16->symbols[uVar33]->field_6).offset <= (pSVar15->field_6).offset) {
                      uVar32 = uVar33 + 1;
                      uVar33 = uVar26;
                    }
                    uVar26 = uVar33;
                  } while (uVar32 != uVar26);
                  for (; pSVar24 = pSVar15, uVar32 <= uVar4; uVar32 = uVar32 + 1) {
LAB_00104890:
                    pSVar15 = pSVar16->symbols[uVar32];
                    pSVar16->symbols[uVar32] = pSVar24;
                  }
                  pSVar16->nbSymbols = uVar4 + 1;
                  SVar21 = pSVar16->modifier;
                  if (SVar21 != SECTION_NORMAL) {
                    if (SVar21 == SECTION_FRAGMENT) {
                      (ppSVar13[uVar31]->field_6).offset =
                           (ppSVar13[uVar31]->field_6).offset + (uint)pSVar16->offset;
                      SVar21 = pSVar16->modifier;
                    }
                    if (SVar21 != SECTION_NORMAL) {
                      pSVar16 = sect_GetSection(pSVar16->name);
                    }
                  }
                  pSVar15 = ppSVar13[uVar31];
                }
                pSVar15->section = pSVar16;
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar11);
            }
            uVar4 = 0;
            uVar32 = 0xfffffff8;
            do {
              iVar5 = getc(__stream);
              if (iVar5 == -1) {
                iVar5 = feof(__stream);
                if (iVar5 == 0) {
                  piVar19 = __errno_location();
                  pcVar10 = strerror(*piVar19);
                }
                else {
                  pcVar10 = "Unexpected end of file";
                }
                pcVar28 = "%s: Cannot read number of assertions: %s";
                goto LAB_0010509d;
              }
              uVar32 = uVar32 + 8;
              uVar4 = uVar4 | iVar5 << ((byte)uVar32 & 0x1f);
            } while (uVar32 < 0x18);
            if (beVerbose == true) {
              fprintf(_stderr,"Reading %u assertions...\n",(ulong)uVar4);
            }
            if (uVar4 != 0) {
              uVar32 = 0;
              do {
                patch_00 = (Assertion *)malloc(0x48);
                if (patch_00 == (Assertion *)0x0) {
                  pcVar10 = "%s: Couldn\'t create new assertion";
                  goto LAB_00105031;
                }
                pFVar9 = nodes[fileID].nodes;
                snprintf(local_48,0x16,"Assertion #%u",(ulong)uVar32);
                readPatch((FILE *)__stream,(Patch *)patch_00,fileName,local_48,0,pFVar9);
                pcVar10 = readstr((FILE *)__stream);
                if (pcVar10 == (char *)0x0) {
                  iVar5 = feof(__stream);
                  if (iVar5 == 0) {
                    piVar19 = __errno_location();
                    pcVar10 = strerror(*piVar19);
                  }
                  else {
                    pcVar10 = "Unexpected end of file";
                  }
                  pcVar28 = "%s: Cannot read assertion\'s message: %s";
LAB_0010509d:
                  errx(pcVar28,fileName,pcVar10);
                }
                patch_00->message = pcVar10;
                uVar11 = (ulong)(patch_00->patch).pcSectionID;
                if (uVar11 == 0xffffffff) {
                  pSVar16 = (Section *)0x0;
                }
                else {
                  pSVar16 = *(Section **)((long)__ptr_00 + uVar11 * 8);
                }
                (patch_00->patch).pcSection = pSVar16;
                patch_00->fileSymbols = ppSVar13;
                patch_00->next = assertions;
                uVar32 = uVar32 + 1;
                assertions = patch_00;
              } while (uVar4 != uVar32);
            }
            free(__ptr_00);
            fclose(__stream);
            return;
          }
          pcVar10 = "Failed to register %s\'s symbol list";
        }
        goto LAB_00105031;
      }
    }
    else {
      if (iVar5 == -1) {
        fatal((FileStackNode *)0x0,0,"File \"%s\" is empty!",fileName);
      }
      nodes[fileID].nbNodes = 1;
      pFVar9 = (FileStackNode *)malloc(0x20);
      pFVar3[fileID].nodes = pFVar9;
      if (pFVar9 != (FileStackNode *)0x0) {
        pFVar9->parent = (FileStackNode *)0x0;
        pFVar9->type = NODE_FILE;
        pcVar10 = strdup(fileName);
        (pFVar9->field_3).name = pcVar10;
        if (pcVar10 == (char *)0x0) {
          piVar19 = __errno_location();
          pcVar10 = strerror(*piVar19);
          fatal((FileStackNode *)0x0,0,"Failed to duplicate \"%s\"\'s name: %s",fileName,pcVar10);
        }
        sdobj_ReadFile(pFVar9,(FILE *)__stream);
        return;
      }
    }
    pcVar10 = "Failed to get memory for %s\'s nodes";
  }
LAB_00105031:
  err(pcVar10,fileName);
}

Assistant:

void obj_ReadFile(char const *fileName, unsigned int fileID)
{
	FILE *file;

	if (strcmp("-", fileName) != 0)
		file = fopen(fileName, "rb");
	else
		file = fdopen(STDIN_FILENO, "rb"); // `stdin` is in text mode by default

	if (!file)
		err("Could not open file %s", fileName);

	// First, check if the object is a RGBDS object or a SDCC one. If the first byte is 'R',
	// we'll assume it's a RGBDS object file, and otherwise, that it's a SDCC object file.
	int c = getc(file);

	ungetc(c, file); // Guaranteed to work
	switch (c) {
	case EOF:
		fatal(NULL, 0, "File \"%s\" is empty!", fileName);

	case 'R':
		break;

	default: // This is (probably) a SDCC object file, defer the rest of detection to it
		// Since SDCC does not provide line info, everything will be reported as coming from the
		// object file. It's better than nothing.
		nodes[fileID].nbNodes = 1;
		nodes[fileID].nodes =
			(struct FileStackNode *)malloc(sizeof(nodes[fileID].nodes[0]) * nodes[fileID].nbNodes);
		if (!nodes[fileID].nodes)
			err("Failed to get memory for %s's nodes", fileName);
		struct FileStackNode *where = &nodes[fileID].nodes[0];

		if (!where)
			fatal(NULL, 0, "Failed to alloc fstack node for \"%s\": %s", fileName, strerror(errno));
		where->parent = NULL;
		where->type = NODE_FILE;
		where->name = strdup(fileName);
		if (!where->name)
			fatal(NULL, 0, "Failed to duplicate \"%s\"'s name: %s", fileName, strerror(errno));

		sdobj_ReadFile(where, file);
		return;
	}

	// Begin by reading the magic bytes
	int matchedElems;

	if (fscanf(file, RGBDS_OBJECT_VERSION_STRING "%n", &matchedElems) == 1
	 && matchedElems != strlen(RGBDS_OBJECT_VERSION_STRING))
		errx("%s: Not a RGBDS object file", fileName);

	verbosePrint("Reading object file %s\n",
		     fileName);

	uint32_t revNum;

	tryReadlong(revNum, file, "%s: Cannot read revision number: %s",
		    fileName);
	if (revNum != RGBDS_OBJECT_REV)
		errx("%s: Unsupported object file for rgblink %s; try rebuilding \"%s\"%s"
			" (expected revision %d, got %d)", fileName, get_package_version_string(),
			fileName, revNum > RGBDS_OBJECT_REV ? " or updating rgblink" : "",
			RGBDS_OBJECT_REV, revNum);

	uint32_t nbSymbols;
	uint32_t nbSections;

	tryReadlong(nbSymbols, file, "%s: Cannot read number of symbols: %s",
		    fileName);
	tryReadlong(nbSections, file, "%s: Cannot read number of sections: %s",
		    fileName);

	nbSectionsToAssign += nbSections;

	tryReadlong(nodes[fileID].nbNodes, file, "%s: Cannot read number of nodes: %s", fileName);
	nodes[fileID].nodes =
		(struct FileStackNode *)calloc(nodes[fileID].nbNodes, sizeof(nodes[fileID].nodes[0]));
	if (!nodes[fileID].nodes)
		err("Failed to get memory for %s's nodes", fileName);
	verbosePrint("Reading %u nodes...\n", nodes[fileID].nbNodes);
	for (uint32_t i = nodes[fileID].nbNodes; i--; )
		readFileStackNode(file, nodes[fileID].nodes, i, fileName);

	// This file's symbols, kept to link sections to them
	struct Symbol **fileSymbols = (struct Symbol **)malloc(sizeof(*fileSymbols) * nbSymbols + 1);

	if (!fileSymbols)
		err("Failed to get memory for %s's symbols", fileName);

	struct SymbolList *symbolList = (struct SymbolList *)malloc(sizeof(*symbolList));

	if (!symbolList)
		err("Failed to register %s's symbol list", fileName);
	symbolList->symbolList = fileSymbols;
	symbolList->nbSymbols = nbSymbols;
	symbolList->next = symbolLists;
	symbolLists = symbolList;

	uint32_t *nbSymPerSect = (uint32_t *)calloc(nbSections ? nbSections : 1,
					sizeof(*nbSymPerSect));

	verbosePrint("Reading %" PRIu32 " symbols...\n", nbSymbols);
	for (uint32_t i = 0; i < nbSymbols; i++) {
		// Read symbol
		struct Symbol *symbol = (struct Symbol *)malloc(sizeof(*symbol));

		if (!symbol)
			err("%s: Couldn't create new symbol", fileName);
		readSymbol(file, symbol, fileName, nodes[fileID].nodes);

		fileSymbols[i] = symbol;
		if (symbol->type == SYMTYPE_EXPORT)
			sym_AddSymbol(symbol);
		if (symbol->sectionID != -1)
			nbSymPerSect[symbol->sectionID]++;
	}

	// This file's sections, stored in a table to link symbols to them
	struct Section **fileSections =
		(struct Section **)malloc(sizeof(*fileSections) * (nbSections ? nbSections : 1));

	verbosePrint("Reading %" PRIu32 " sections...\n", nbSections);
	for (uint32_t i = 0; i < nbSections; i++) {
		// Read section
		fileSections[i] = (struct Section *)malloc(sizeof(*fileSections[i]));
		if (!fileSections[i])
			err("%s: Couldn't create new section", fileName);

		fileSections[i]->nextu = NULL;
		readSection(file, fileSections[i], fileName, nodes[fileID].nodes);
		fileSections[i]->fileSymbols = fileSymbols;
		if (nbSymPerSect[i]) {
			fileSections[i]->symbols =
				(struct Symbol **)malloc(nbSymPerSect[i] * sizeof(*fileSections[i]->symbols));
			if (!fileSections[i]->symbols)
				err("%s: Couldn't link to symbols",
				    fileName);
		} else {
			fileSections[i]->symbols = NULL;
		}
		fileSections[i]->nbSymbols = 0;

		sect_AddSection(fileSections[i]);
	}

	free(nbSymPerSect);

	// Give patches' PC section pointers to their sections
	for (uint32_t i = 0; i < nbSections; i++) {
		if (sect_HasData(fileSections[i]->type)) {
			for (uint32_t j = 0; j < fileSections[i]->nbPatches; j++)
				linkPatchToPCSect(&fileSections[i]->patches[j], fileSections);
		}
	}

	// Give symbols' section pointers to their sections
	for (uint32_t i = 0; i < nbSymbols; i++) {
		int32_t sectionID = fileSymbols[i]->sectionID;

		if (sectionID == -1) {
			fileSymbols[i]->section = NULL;
		} else {
			struct Section *section = fileSections[sectionID];

			// Give the section a pointer to the symbol as well
			linkSymToSect(fileSymbols[i], section);

			if (section->modifier != SECTION_NORMAL) {
				if (section->modifier == SECTION_FRAGMENT)
					// Add the fragment's offset to the symbol's
					fileSymbols[i]->offset += section->offset;
				section = getMainSection(section);
			}
			fileSymbols[i]->section = section;
		}
	}

	uint32_t nbAsserts;

	tryReadlong(nbAsserts, file, "%s: Cannot read number of assertions: %s",
		    fileName);
	verbosePrint("Reading %" PRIu32 " assertions...\n", nbAsserts);
	for (uint32_t i = 0; i < nbAsserts; i++) {
		struct Assertion *assertion = (struct Assertion *)malloc(sizeof(*assertion));

		if (!assertion)
			err("%s: Couldn't create new assertion", fileName);
		readAssertion(file, assertion, fileName, i, nodes[fileID].nodes);
		linkPatchToPCSect(&assertion->patch, fileSections);
		assertion->fileSymbols = fileSymbols;
		assertion->next = assertions;
		assertions = assertion;
	}

	free(fileSections);
	fclose(file);
}